

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node *node,char_t *indent,uint flags,uint depth)

{
  bool bVar1;
  bool bVar2;
  xml_node_type xVar3;
  unspecified_bool_type p_Var4;
  char_t *pcVar5;
  undefined4 in_register_0000000c;
  uint *__n;
  size_t sVar6;
  char_t *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_03;
  void *extraout_RDX_05;
  void *pvVar7;
  void *extraout_RDX_06;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *extraout_RDX_09;
  void *__buf_14;
  int local_110;
  int local_d0;
  uint local_bc;
  uint i_1;
  xml_node local_b0;
  xml_node n_2;
  xml_node local_a0;
  xml_node local_98;
  xml_node local_90;
  xml_node local_88;
  xml_node local_80;
  xml_node local_78;
  xml_node local_70;
  xml_node_struct *local_68;
  xml_node local_60;
  xml_node n_1;
  char_t *name;
  xml_node local_40;
  xml_node n;
  uint i;
  char_t *default_name;
  uint depth_local;
  uint flags_local;
  char_t *indent_local;
  xml_node *node_local;
  xml_buffered_writer *writer_local;
  
  sVar6 = CONCAT44(in_register_0000000c,flags);
  if (((flags & 1) != 0) && ((flags & 4) == 0)) {
    pcVar5 = indent;
    for (n._root._4_4_ = 0; n._root._4_4_ < depth; n._root._4_4_ = n._root._4_4_ + 1) {
      xml_buffered_writer::write(writer,(int)indent,pcVar5,sVar6);
      pcVar5 = extraout_RDX;
    }
  }
  xVar3 = xml_node::type(node);
  __n = &switchD_00129e9a::switchdataD_0014b5bc;
  switch(xVar3) {
  case node_document:
    local_40 = xml_node::first_child(node);
    while (p_Var4 = xml_node::operator_cast_to_function_pointer(&local_40),
          p_Var4 != (unspecified_bool_type)0x0) {
      node_output(writer,&local_40,indent,flags,depth);
      local_40 = xml_node::next_sibling(&local_40);
    }
    break;
  case node_element:
    pcVar5 = xml_node::name(node);
    if (*pcVar5 == '\0') {
      local_d0 = 0x14cc8c;
      pvVar7 = extraout_RDX_00;
    }
    else {
      pcVar5 = xml_node::name(node);
      local_d0 = (int)pcVar5;
      pvVar7 = extraout_RDX_01;
    }
    xml_buffered_writer::write(writer,0x3c,pvVar7,(size_t)__n);
    xml_buffered_writer::write(writer,local_d0,__buf,(size_t)__n);
    node_output_attributes
              ((anon_unknown_0 *)writer,(xml_buffered_writer *)node,(xml_node *)(ulong)flags,
               (uint)__n);
    if ((flags & 4) == 0) {
      local_70 = xml_node::first_child(node);
      bVar1 = xml_node::operator!(&local_70);
      if (bVar1) {
        xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
      }
      else {
        local_78 = xml_node::first_child(node);
        local_80 = xml_node::last_child(node);
        bVar2 = xml_node::operator==(&local_78,&local_80);
        sVar6 = CONCAT71((int7)((ulong)__n >> 8),bVar2);
        bVar1 = false;
        pvVar7 = extraout_RDX_02;
        if (bVar2) {
          local_88 = xml_node::first_child(node);
          xVar3 = xml_node::type(&local_88);
          sVar6 = (size_t)xVar3;
          bVar1 = true;
          pvVar7 = extraout_RDX_03;
          if (xVar3 != node_pcdata) {
            local_90 = xml_node::first_child(node);
            xVar3 = xml_node::type(&local_90);
            bVar1 = xVar3 == node_cdata;
            pvVar7 = extraout_RDX_04;
          }
        }
        if (bVar1) {
          xml_buffered_writer::write(writer,0x3e,pvVar7,sVar6);
          local_98 = xml_node::first_child(node);
          xVar3 = xml_node::type(&local_98);
          if (xVar3 == node_pcdata) {
            local_a0 = xml_node::first_child(node);
            pcVar5 = xml_node::value(&local_a0);
            sVar6 = (size_t)flags;
            text_output(writer,pcVar5,ctx_special_pcdata,flags);
          }
          else {
            n_2 = xml_node::first_child(node);
            pcVar5 = xml_node::value(&n_2);
            text_output_cdata(writer,pcVar5);
          }
          xml_buffered_writer::write(writer,0x3c,(void *)0x2f,sVar6);
          xml_buffered_writer::write(writer,local_d0,__buf_03,sVar6);
          xml_buffered_writer::write(writer,0x3e,(void *)0xa,sVar6);
        }
        else {
          xml_buffered_writer::write(writer,0x3e,(void *)0xa,sVar6);
          local_b0 = xml_node::first_child(node);
          while (p_Var4 = xml_node::operator_cast_to_function_pointer(&local_b0),
                p_Var4 != (unspecified_bool_type)0x0) {
            sVar6 = (size_t)flags;
            node_output(writer,&local_b0,indent,flags,depth + 1);
            local_b0 = xml_node::next_sibling(&local_b0);
          }
          if (((flags & 1) != 0) && ((flags & 4) == 0)) {
            pvVar7 = extraout_RDX_05;
            for (local_bc = 0; local_bc < depth; local_bc = local_bc + 1) {
              xml_buffered_writer::write(writer,(int)indent,pvVar7,sVar6);
              pvVar7 = extraout_RDX_06;
            }
          }
          xml_buffered_writer::write(writer,0x3c,(void *)0x2f,sVar6);
          xml_buffered_writer::write(writer,local_d0,__buf_04,sVar6);
          xml_buffered_writer::write(writer,0x3e,(void *)0xa,sVar6);
        }
      }
    }
    else {
      n_1 = xml_node::first_child(node);
      bVar1 = xml_node::operator!(&n_1);
      if (bVar1) {
        xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
      }
      else {
        xml_buffered_writer::write(writer,0x3e,__buf_00,(size_t)__n);
        local_60 = xml_node::first_child(node);
        while (p_Var4 = xml_node::operator_cast_to_function_pointer(&local_60),
              p_Var4 != (unspecified_bool_type)0x0) {
          __n = (uint *)(ulong)flags;
          node_output(writer,&local_60,indent,flags,depth + 1);
          local_68 = (xml_node_struct *)xml_node::next_sibling(&local_60);
          local_60 = (xml_node)local_68;
        }
        xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)__n);
        xml_buffered_writer::write(writer,local_d0,__buf_01,(size_t)__n);
        xml_buffered_writer::write(writer,0x3e,__buf_02,(size_t)__n);
      }
    }
    break;
  case node_pcdata:
    pcVar5 = xml_node::value(node);
    sVar6 = (size_t)flags;
    text_output(writer,pcVar5,ctx_special_pcdata,flags);
    if ((flags & 4) == 0) {
      xml_buffered_writer::write(writer,10,__buf_05,sVar6);
    }
    break;
  case node_cdata:
    pcVar5 = xml_node::value(node);
    text_output_cdata(writer,pcVar5);
    if ((flags & 4) == 0) {
      xml_buffered_writer::write(writer,10,__buf_06,(size_t)__n);
    }
    break;
  case node_comment:
    sVar6 = 0x2d;
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
    pcVar5 = xml_node::value(node);
    xml_buffered_writer::write(writer,(int)pcVar5,__buf_07,sVar6);
    sVar6 = 0x3e;
    xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
    if ((flags & 4) == 0) {
      xml_buffered_writer::write(writer,10,__buf_08,sVar6);
    }
    break;
  case node_pi:
  case node_declaration:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x14b5bc);
    pcVar5 = xml_node::name(node);
    if (*pcVar5 == '\0') {
      local_110 = 0x14cc8c;
      pvVar7 = extraout_RDX_07;
    }
    else {
      pcVar5 = xml_node::name(node);
      local_110 = (int)pcVar5;
      pvVar7 = extraout_RDX_08;
    }
    xml_buffered_writer::write(writer,local_110,pvVar7,(size_t)__n);
    xVar3 = xml_node::type(node);
    if (xVar3 == node_declaration) {
      node_output_attributes
                ((anon_unknown_0 *)writer,(xml_buffered_writer *)node,(xml_node *)(ulong)flags,
                 (uint)__n);
    }
    else {
      pcVar5 = xml_node::value(node);
      if (*pcVar5 != '\0') {
        xml_buffered_writer::write(writer,0x20,__buf_09,(size_t)__n);
        pcVar5 = xml_node::value(node);
        xml_buffered_writer::write(writer,(int)pcVar5,__buf_10,(size_t)__n);
      }
    }
    xml_buffered_writer::write(writer,0x3f,(void *)0x3e,(size_t)__n);
    if ((flags & 4) == 0) {
      xml_buffered_writer::write(writer,10,__buf_11,(size_t)__n);
    }
    break;
  case node_doctype:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    sVar6 = 0x50;
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    pcVar5 = xml_node::value(node);
    pvVar7 = __buf_12;
    if (*pcVar5 != '\0') {
      xml_buffered_writer::write(writer,0x20,__buf_12,sVar6);
      pcVar5 = xml_node::value(node);
      xml_buffered_writer::write(writer,(int)pcVar5,__buf_13,sVar6);
      pvVar7 = extraout_RDX_09;
    }
    xml_buffered_writer::write(writer,0x3e,pvVar7,sVar6);
    if ((flags & 4) == 0) {
      xml_buffered_writer::write(writer,10,__buf_14,sVar6);
    }
    break;
  default:
    __assert_fail("!\"Invalid node type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xc84,
                  "void pugi::impl::(anonymous namespace)::node_output(xml_buffered_writer &, const xml_node &, const char_t *, unsigned int, unsigned int)"
                 );
  }
  return;
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, const xml_node& node, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
			for (unsigned int i = 0; i < depth; ++i) writer.write(indent);

		switch (node.type())
		{
		case node_document:
		{
			for (xml_node n = node.first_child(); n; n = n.next_sibling())
				node_output(writer, n, indent, flags, depth);
			break;
		}
			
		case node_element:
		{
			const char_t* name = node.name()[0] ? node.name() : default_name;

			writer.write('<');
			writer.write(name);

			node_output_attributes(writer, node, flags);

			if (flags & format_raw)
			{
				if (!node.first_child())
					writer.write(' ', '/', '>');
				else
				{
					writer.write('>');

					for (xml_node n = node.first_child(); n; n = n.next_sibling())
						node_output(writer, n, indent, flags, depth + 1);

					writer.write('<', '/');
					writer.write(name);
					writer.write('>');
				}
			}
			else if (!node.first_child())
				writer.write(' ', '/', '>', '\n');
			else if (node.first_child() == node.last_child() && (node.first_child().type() == node_pcdata || node.first_child().type() == node_cdata))
			{
				writer.write('>');

				if (node.first_child().type() == node_pcdata)
					text_output(writer, node.first_child().value(), ctx_special_pcdata, flags);
				else
					text_output_cdata(writer, node.first_child().value());

				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}
			else
			{
				writer.write('>', '\n');
				
				for (xml_node n = node.first_child(); n; n = n.next_sibling())
					node_output(writer, n, indent, flags, depth + 1);

				if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
					for (unsigned int i = 0; i < depth; ++i) writer.write(indent);
				
				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}

			break;
		}
		
		case node_pcdata:
			text_output(writer, node.value(), ctx_special_pcdata, flags);
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_cdata:
			text_output_cdata(writer, node.value());
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_comment:
			writer.write('<', '!', '-', '-');
			writer.write(node.value());
			writer.write('-', '-', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_pi:
		case node_declaration:
			writer.write('<', '?');
			writer.write(node.name()[0] ? node.name() : default_name);

			if (node.type() == node_declaration)
			{
				node_output_attributes(writer, node, flags);
			}
			else if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('?', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_doctype:
			writer.write('<', '!', 'D', 'O', 'C');
			writer.write('T', 'Y', 'P', 'E');

			if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		default:
			assert(!"Invalid node type");
		}
	}